

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O0

void start_pass_1_quant(j_decompress_ptr cinfo,boolean is_pre_scan)

{
  long lVar1;
  void *target;
  undefined4 in_ESI;
  long *in_RDI;
  int i;
  j_decompress_ptr unaff_retaddr;
  size_t arraysize;
  my_cquantize_ptr cquantize;
  int iVar2;
  int iVar3;
  undefined4 in_stack_fffffffffffffff0;
  
  lVar1 = in_RDI[0x4e];
  in_RDI[0x14] = *(long *)(lVar1 + 0x20);
  *(undefined4 *)((long)in_RDI + 0x9c) = *(undefined4 *)(lVar1 + 0x28);
  iVar2 = (int)in_RDI[0xe];
  if (iVar2 == 0) {
    if ((int)in_RDI[0x12] == 3) {
      *(code **)(lVar1 + 8) = color_quantize3;
    }
    else {
      *(code **)(lVar1 + 8) = color_quantize;
    }
  }
  else if (iVar2 == 1) {
    if ((int)in_RDI[0x12] == 3) {
      *(code **)(lVar1 + 8) = quantize3_ord_dither;
    }
    else {
      *(code **)(lVar1 + 8) = quantize_ord_dither;
    }
    *(undefined4 *)(lVar1 + 0x4c) = 0;
    if (*(int *)(lVar1 + 0x38) == 0) {
      create_colorindex(unaff_retaddr);
    }
    if (*(long *)(lVar1 + 0x50) == 0) {
      create_odither_tables((j_decompress_ptr)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    }
  }
  else if (iVar2 == 2) {
    *(code **)(lVar1 + 8) = quantize_fs_dither;
    *(undefined4 *)(lVar1 + 0x90) = 0;
    if (*(long *)(lVar1 + 0x70) == 0) {
      alloc_fs_workspace((j_decompress_ptr)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    }
    target = (void *)((ulong)((int)in_RDI[0x11] + 2) << 1);
    for (iVar3 = 0; iVar3 < (int)in_RDI[0x12]; iVar3 = iVar3 + 1) {
      jzero_far(target,CONCAT44(iVar3,iVar2));
    }
  }
  else {
    *(undefined4 *)(*in_RDI + 0x28) = 0x30;
    (**(code **)*in_RDI)(in_RDI);
  }
  return;
}

Assistant:

METHODDEF(void)
start_pass_1_quant(j_decompress_ptr cinfo, boolean is_pre_scan)
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  size_t arraysize;
  int i;

  /* Install my colormap. */
  cinfo->colormap = cquantize->sv_colormap;
  cinfo->actual_number_of_colors = cquantize->sv_actual;

  /* Initialize for desired dithering mode. */
  switch (cinfo->dither_mode) {
  case JDITHER_NONE:
    if (cinfo->out_color_components == 3)
      cquantize->pub.color_quantize = color_quantize3;
    else
      cquantize->pub.color_quantize = color_quantize;
    break;
  case JDITHER_ORDERED:
    if (cinfo->out_color_components == 3)
      cquantize->pub.color_quantize = quantize3_ord_dither;
    else
      cquantize->pub.color_quantize = quantize_ord_dither;
    cquantize->row_index = 0;   /* initialize state for ordered dither */
    /* If user changed to ordered dither from another mode,
     * we must recreate the color index table with padding.
     * This will cost extra space, but probably isn't very likely.
     */
    if (!cquantize->is_padded)
      create_colorindex(cinfo);
    /* Create ordered-dither tables if we didn't already. */
    if (cquantize->odither[0] == NULL)
      create_odither_tables(cinfo);
    break;
  case JDITHER_FS:
    cquantize->pub.color_quantize = quantize_fs_dither;
    cquantize->on_odd_row = FALSE; /* initialize state for F-S dither */
    /* Allocate Floyd-Steinberg workspace if didn't already. */
    if (cquantize->fserrors[0] == NULL)
      alloc_fs_workspace(cinfo);
    /* Initialize the propagated errors to zero. */
    arraysize = (size_t)((cinfo->output_width + 2) * sizeof(FSERROR));
    for (i = 0; i < cinfo->out_color_components; i++)
      jzero_far((void *)cquantize->fserrors[i], arraysize);
    break;
  default:
    ERREXIT(cinfo, JERR_NOT_COMPILED);
    break;
  }
}